

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.h
# Opt level: O3

void __thiscall gui::LabelStyle::~LabelStyle(LabelStyle *this)

{
  ~LabelStyle(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~LabelStyle() = default;